

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int vcf_write(htsFile *fp,bcf_hdr_t *h,bcf1_t *v)

{
  BGZF *fp_00;
  ulong totalbytes;
  char *__src;
  ulong __n;
  ulong uVar1;
  
  (fp->line).l = 0;
  vcf_format(h,v,&fp->line);
  fp_00 = (BGZF *)(fp->fp).hfile;
  totalbytes = (fp->line).l;
  __src = (fp->line).s;
  if ((fp->format).compression == no_compression) {
    uVar1 = fp_00->uncompressed_address - (long)*(void **)&fp_00->block_length;
    __n = totalbytes;
    if (uVar1 < totalbytes) {
      __n = uVar1;
    }
    memcpy(*(void **)&fp_00->block_length,__src,__n);
    *(ulong *)&fp_00->block_length = *(long *)&fp_00->block_length + __n;
    if (uVar1 < totalbytes) {
      __n = hwrite2((hFILE *)fp_00,__src,totalbytes,__n);
    }
  }
  else {
    __n = bgzf_write(fp_00,__src,totalbytes);
  }
  return -(uint)((long)(int)__n != (fp->line).l);
}

Assistant:

int vcf_write(htsFile *fp, const bcf_hdr_t *h, bcf1_t *v)
{
    int ret;
    fp->line.l = 0;
    vcf_format1(h, v, &fp->line);
    if ( fp->format.compression!=no_compression )
        ret = bgzf_write(fp->fp.bgzf, fp->line.s, fp->line.l);
    else
        ret = hwrite(fp->fp.hfile, fp->line.s, fp->line.l);
    return ret==fp->line.l ? 0 : -1;
}